

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitCommonExpr(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                *this,CommonExpr e)

{
  BasicWriter<char> *this_00;
  BasicStringRef<char> value;
  string *psVar1;
  
  this_00 = this->writer_;
  psVar1 = BasicProblem<mp::BasicProblemParams<int>>::VarNamer::dvname_abi_cxx11_
                     ((VarNamer *)&this->vnam_,
                      *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.
                                     super_ExprBase.impl_ + 4));
  value.data_ = (psVar1->_M_dataplus)._M_p;
  value.size_ = psVar1->_M_string_length;
  fmt::BasicWriter<char>::operator<<(this_00,value);
  return;
}

Assistant:

void VisitCommonExpr(CommonExpr e)
  { writer_ << vnam_.dvname(e.index()); }